

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-store-sell.c
# Opt level: O0

int borg_min_item_quantity(borg_item_conflict *item)

{
  borg_item_conflict *item_local;
  
  if (borg.trait[0x2d] < 0xfa) {
    item_local._4_4_ = 1;
  }
  else if (item->value < 6) {
    if ((item->aware & 1U) == 0) {
      item_local._4_4_ = 1;
    }
    else if (item->tval - 2 < 3) {
      if (item->iqty < 5) {
        item_local._4_4_ = (uint)item->iqty;
      }
      else {
        item_local._4_4_ = 5;
      }
    }
    else if (item->tval == 0x1c) {
      if (item->iqty < 3) {
        item_local._4_4_ = (uint)item->iqty;
      }
      else {
        item_local._4_4_ = 3;
      }
    }
    else {
      item_local._4_4_ = 1;
    }
  }
  else {
    item_local._4_4_ = 1;
  }
  return item_local._4_4_;
}

Assistant:

int borg_min_item_quantity(borg_item *item)
{
    /* Only trade in bunches if sufficient cash */
    if (borg.trait[BI_GOLD] < 250)
        return 1;

    /* Don't trade expensive items in bunches */
    if (item->value > 5)
        return 1;

    /* Don't trade non-known items in bunches */
    if (!item->aware)
        return 1;

    /* Only allow some types */
    switch (item->tval) {
    case TV_SHOT:
    case TV_ARROW:
    case TV_BOLT:
        /* Maximum number of items */
        if (item->iqty < 5)
            return (item->iqty);
        return 5;

    case TV_FOOD:
        if (item->iqty < 3)
            return (item->iqty);
        return 3;
#if 0
    case TV_POTION:
    case TV_SCROLL:
    if (item->iqty < 2)
        return (item->iqty);
    return 2;
#endif

    default:
        return 1;
    }
}